

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

void __thiscall implementations::scheme::SchemeFrame::execute(SchemeFrame *this)

{
  SubframeMode SVar1;
  int iVar2;
  runtime_error *this_00;
  cell res;
  
  iVar2 = (*(this->
            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
            )._vptr_Frame[2])();
  if ((char)iVar2 == '\0') {
    if (this->subframe == (SchemeFrame *)0x0) {
      if ((this->arg_it)._M_current !=
          (this->arguments).
          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        nextArgument(this);
        return;
      }
      dispatch(this);
      return;
    }
    execute(this->subframe);
    iVar2 = (*(this->subframe->
              super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
              )._vptr_Frame[2])();
    if ((char)iVar2 != '\0') {
      cell::cell(&res,&(this->subframe->
                       super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                       ).result);
      SVar1 = this->subframe_mode;
      if (this->subframe != (SchemeFrame *)0x0) {
        (*(this->subframe->
          super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
          )._vptr_Frame[1])();
      }
      this->subframe = (SchemeFrame *)0x0;
      this->subframe_mode = None;
      if (SVar1 == Procedure) {
        cell::operator=(&(this->
                         super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                         ).result,&res);
        nextExpression(this);
      }
      else {
        if (SVar1 != Argument) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Invalid subframe mode None");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
        push_back(&this->resolved_arguments,&res);
        (this->arg_it)._M_current = (this->arg_it)._M_current + 1;
        nextArgument(this);
      }
      cell::~cell(&res);
    }
  }
  return;
}

Assistant:

void execute() {
		if (isResolved())
			return;
		if (subframe != nullptr) {
			subframe->execute();
			if (subframe->isResolved()) {
				// Copy results
				cell res(subframe->result);
				auto mode = subframe_mode;
				DEBUG("  subframe(" + std::string((mode == Argument ? "arg" : "proc")) + ") = " + to_string(res));
				// Clear subframe
				delete subframe;
				subframe = nullptr;
				subframe_mode = None;
				// Do something with result
				switch (mode) {
				case Argument:
					resolved_arguments.push_back(res);
					++arg_it;
					nextArgument();
					break;
				case Procedure:
					result = res;
					nextExpression();
					break;
				default:
					throw std::runtime_error("Invalid subframe mode None");
				}
			}
		}  else if (arg_it == arguments.cend())
			dispatch();
		else
			nextArgument();
	}